

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_manager.cpp
# Opt level: O0

cab * __thiscall cab_manager::create(cab_manager *this,weak_ptr<cab_session> *cab_session)

{
  mapped_type *pmVar1;
  __shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  mapped_type *this_00;
  weak_ptr<cab> local_50;
  node_type local_3d [13];
  road_network *local_30;
  undefined1 local_28 [16];
  weak_ptr<cab_session> *pwStack_18;
  id_type id;
  weak_ptr<cab_session> *cab_session_local;
  cab_manager *this_local;
  
  local_28._12_4_ = this->_counter;
  this->_counter = local_28._12_4_ + 1;
  local_30 = &this->_rnet;
  pwStack_18 = cab_session;
  cab_session_local = (weak_ptr<cab_session> *)this;
  std::make_unique<cab,std::weak_ptr<cab_session>&,cab_manager&,unsigned_int&,road_network*>
            ((weak_ptr<cab_session> *)local_28,(cab_manager *)cab_session,(uint *)this,
             (road_network **)(local_28 + 0xc));
  pmVar1 = std::
           unordered_map<unsigned_int,_std::shared_ptr<cab>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>_>
           ::operator[](&this->_cabs,(key_type *)(local_28 + 0xc));
  std::shared_ptr<cab>::operator=(pmVar1,(unique_ptr<cab,_std::default_delete<cab>_> *)local_28);
  std::unique_ptr<cab,_std::default_delete<cab>_>::~unique_ptr
            ((unique_ptr<cab,_std::default_delete<cab>_> *)local_28);
  p_Var2 = (__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::
           unordered_map<unsigned_int,_std::shared_ptr<cab>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>_>
           ::operator[](&this->_cabs,(key_type *)(local_28 + 0xc));
  peVar3 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var2);
  local_3d[0] = cab::position(peVar3);
  this_00 = std::
            map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
            ::operator[](&this->_cabs_at_node,local_3d);
  pmVar1 = std::
           unordered_map<unsigned_int,_std::shared_ptr<cab>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>_>
           ::operator[](&this->_cabs,(key_type *)(local_28 + 0xc));
  std::weak_ptr<cab>::weak_ptr<cab,void>(&local_50,pmVar1);
  std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::push_back
            (this_00,&local_50);
  std::weak_ptr<cab>::~weak_ptr(&local_50);
  p_Var2 = (__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::
           unordered_map<unsigned_int,_std::shared_ptr<cab>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>_>
           ::operator[](&this->_cabs,(key_type *)(local_28 + 0xc));
  peVar3 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     (p_Var2);
  return peVar3;
}

Assistant:

cab& cab_manager::create(std::weak_ptr<cab_session> cab_session)
{
    auto id = _counter++;
    _cabs[id] = std::make_unique<cab>(cab_session, *this, id, &_rnet);
    
    _cabs_at_node[_cabs[id]->position()].push_back(_cabs[id]);

    return *_cabs[id];
}